

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mini-gmp.c
# Opt level: O0

void mpz_div_q_2exp(__mpz_struct *q,__mpz_struct *u,mp_bitcnt_t bit_index,mpz_div_round_mode mode)

{
  bool bVar1;
  int iVar2;
  __mpz_struct *p_Var3;
  ulong uVar4;
  ulong uVar5;
  uint in_ECX;
  ulong in_RDX;
  long in_RSI;
  int *in_RDI;
  int adjust;
  mp_ptr qp;
  mp_size_t limb_cnt;
  mp_size_t qn;
  mp_size_t un;
  __mpz_struct *in_stack_ffffffffffffff98;
  __mpz_struct *in_stack_ffffffffffffffa0;
  __mpz_struct *p_Var6;
  undefined7 in_stack_ffffffffffffffa8;
  char in_stack_ffffffffffffffaf;
  __mpz_struct *r;
  long local_30;
  
  p_Var3 = (__mpz_struct *)(long)*(int *)(in_RSI + 4);
  if (p_Var3 == (__mpz_struct *)0x0) {
    in_RDI[1] = 0;
  }
  else {
    uVar4 = in_RDX >> 6;
    r = p_Var3;
    if ((long)p_Var3 < 0) {
      r = (__mpz_struct *)-(long)p_Var3;
    }
    local_30 = (long)r - uVar4;
    uVar5 = in_RDX & 0x3f;
    if (in_ECX == 0 < (long)p_Var3) {
      in_stack_ffffffffffffffaf = true;
      bVar1 = (bool)in_stack_ffffffffffffffaf;
      if (0 < local_30) {
        iVar2 = mpn_zero_p((mp_srcptr)in_stack_ffffffffffffffa0,(mp_size_t)in_stack_ffffffffffffff98
                          );
        in_stack_ffffffffffffffaf = true;
        bVar1 = (bool)in_stack_ffffffffffffffaf;
        if (iVar2 != 0) {
          in_stack_ffffffffffffffaf =
               (*(ulong *)(*(long *)(in_RSI + 8) + uVar4 * 8) & (1L << (sbyte)uVar5) - 1U) != 0;
          bVar1 = (bool)in_stack_ffffffffffffffaf;
        }
      }
    }
    else {
      bVar1 = false;
    }
    if (local_30 < 1) {
      local_30._0_4_ = 0;
    }
    else {
      if (*in_RDI < local_30) {
        in_stack_ffffffffffffffa0 =
             (__mpz_struct *)
             mpz_realloc(r,CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8));
      }
      else {
        in_stack_ffffffffffffffa0 = *(__mpz_struct **)(in_RDI + 2);
      }
      if (uVar5 == 0) {
        mpn_copyi((mp_ptr)in_stack_ffffffffffffffa0,(mp_srcptr)(*(long *)(in_RSI + 8) + uVar4 * 8),
                  local_30);
      }
      else {
        p_Var6 = in_stack_ffffffffffffffa0;
        mpn_rshift((mp_ptr)in_stack_ffffffffffffffa0,(mp_srcptr)(*(long *)(in_RSI + 8) + uVar4 * 8),
                   local_30,(uint)uVar5);
        local_30 = local_30 -
                   (ulong)(*(mp_ptr)((long)in_stack_ffffffffffffffa0 + (local_30 + -1) * 8) == 0);
        in_stack_ffffffffffffffa0 = p_Var6;
      }
    }
    in_RDI[1] = (int)local_30;
    if (bVar1 != false) {
      mpz_add_ui(r,(__mpz_struct *)CONCAT17(in_stack_ffffffffffffffaf,in_stack_ffffffffffffffa8),
                 (unsigned_long)in_stack_ffffffffffffffa0);
    }
    if ((long)p_Var3 < 0) {
      mpz_neg(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
    }
  }
  return;
}

Assistant:

static void
mpz_div_q_2exp (mpz_t q, const mpz_t u, mp_bitcnt_t bit_index,
		enum mpz_div_round_mode mode)
{
  mp_size_t un, qn;
  mp_size_t limb_cnt;
  mp_ptr qp;
  int adjust;

  un = u->_mp_size;
  if (un == 0)
    {
      q->_mp_size = 0;
      return;
    }
  limb_cnt = bit_index / GMP_LIMB_BITS;
  qn = GMP_ABS (un) - limb_cnt;
  bit_index %= GMP_LIMB_BITS;

  if (mode == ((un > 0) ? GMP_DIV_CEIL : GMP_DIV_FLOOR)) /* un != 0 here. */
    /* Note: Below, the final indexing at limb_cnt is valid because at
       that point we have qn > 0. */
    adjust = (qn <= 0
	      || !mpn_zero_p (u->_mp_d, limb_cnt)
	      || (u->_mp_d[limb_cnt]
		  & (((mp_limb_t) 1 << bit_index) - 1)));
  else
    adjust = 0;

  if (qn <= 0)
    qn = 0;
  else
    {
      qp = MPZ_REALLOC (q, qn);

      if (bit_index != 0)
	{
	  mpn_rshift (qp, u->_mp_d + limb_cnt, qn, bit_index);
	  qn -= qp[qn - 1] == 0;
	}
      else
	{
	  mpn_copyi (qp, u->_mp_d + limb_cnt, qn);
	}
    }

  q->_mp_size = qn;

  if (adjust)
    mpz_add_ui (q, q, 1);
  if (un < 0)
    mpz_neg (q, q);
}